

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::hash(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
             vector<int,_std::allocator<int>_> *su)

{
  int iVar1;
  size_type sVar2;
  uint *puVar3;
  reference pvVar4;
  int *piVar5;
  byte bVar6;
  value_type local_54;
  int window_width;
  uint local_4c;
  int src_bits;
  int x;
  int i;
  int dst_bits;
  int *p;
  undefined1 local_21;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *su_local;
  Arcflow *this_local;
  vector<int,_std::allocator<int>_> *h;
  
  local_21 = 0;
  local_20 = su;
  su_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (Arcflow *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)hash::last_size);
  _i = (uint *)0x0;
  x = 0;
  for (src_bits = 0; iVar1 = src_bits,
      sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20), iVar1 < (int)sVar2;
      src_bits = src_bits + 1) {
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)src_bits);
    local_4c = *puVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->hash_bits,(long)src_bits);
    for (window_width = *pvVar4; window_width != 0; window_width = window_width - iVar1) {
      if (x == 0) {
        local_54 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_54);
        _i = (uint *)std::vector<int,_std::allocator<int>_>::back(__return_storage_ptr__);
        x = 0x20;
      }
      piVar5 = std::min<int>(&window_width,&x);
      iVar1 = *piVar5;
      bVar6 = (byte)iVar1;
      *_i = *_i << (bVar6 & 0x1f);
      *_i = local_4c & (1 << (bVar6 & 0x1f)) - 1U | *_i;
      local_4c = (int)local_4c >> (bVar6 & 0x1f);
      x = x - iVar1;
    }
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  hash::last_size = (int)sVar2;
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> Arcflow::hash(const std::vector<int> &su) {
	static int last_size = 1;
	std::vector<int> h;
	h.reserve(last_size);
	int *p = NULL, dst_bits = 0;
	for (int i = 0; i < static_cast<int>(su.size()); i++) {
		int x = su[i];
		int src_bits = hash_bits[i];
		while (src_bits != 0) {
			if (dst_bits == 0) {
				h.push_back(0);
				p = &h.back();
				dst_bits = sizeof(int) * 8;
			}
			int window_width = std::min(src_bits, dst_bits);
			*p <<= window_width;
			*p |= x & ((1u << window_width) - 1);
			x >>= window_width;
			src_bits -= window_width;
			dst_bits -= window_width;
		}
	}
	last_size = h.size();
	return h;
}